

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

ostream * covenant::operator<<(ostream *o,Rule *r)

{
  Sym s;
  pointer pSVar1;
  type this;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  TermFactory tfac;
  shared_ptr<covenant::TerminalFactory> local_60;
  string local_50;
  
  if ((r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<(o,"e");
  }
  else {
    local_60.px = (r->_tfac).px;
    local_60.pn.pi_ = (r->_tfac).pn.pi_;
    if (local_60.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_60.pn.pi_)->use_count_ = (local_60.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    if (local_60.px == (element_type *)0x0) {
      __assert_fail("tfac",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/CFG.h"
                    ,0xa0,"ostream &covenant::operator<<(ostream &, Rule)");
    }
    uVar3 = 0;
    while( true ) {
      uVar4 = (ulong)uVar3;
      pSVar1 = (r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(r->_syms).super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 2) <= uVar4)
      break;
      s.x = pSVar1[uVar4].x;
      if ((s.x & 1U) == 0) {
        this = boost::shared_ptr<covenant::TerminalFactory>::operator->(&local_60);
        TerminalFactory::remap_abi_cxx11_
                  (&local_50,this,
                   (long)((r->_syms).
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4].x >> 1));
        poVar2 = std::operator<<(o,(string *)&local_50);
        std::operator<<(poVar2," ");
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        poVar2 = operator<<(o,s);
        std::operator<<(poVar2," ");
      }
      uVar3 = uVar3 + 1;
    }
    boost::detail::shared_count::~shared_count(&local_60.pn);
  }
  return o;
}

Assistant:

ostream& operator<<(ostream& o, Rule r)
    {
      if( r._syms.size() == 0 )
      { 
        o << "e"; 
      } 
      else 
      {
        TermFactory tfac = r.getTermFactory ();
        assert (tfac);
        for( unsigned int i=0; i < r._syms.size(); i++ )
        {
          if (r._syms[i].isVar ())
          {
            o << r._syms[i] << " " ;
          }
          else
          {
            // we apply the dictionary to output the corresponding
            // string.
            o << tfac->remap(r._syms[i].symID ()) << " " ;
          }
        }
      }
      return o;
    }